

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
despot::VNode::VNode
          (VNode *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          int depth,QNode *parent,OBS_TYPE edge)

{
  int iVar1;
  size_type sVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  reference ppSVar5;
  int local_40;
  int i;
  OBS_TYPE edge_local;
  QNode *parent_local;
  int depth_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  VNode *this_local;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&this->particles_,particles);
  this->belief_ = (Belief *)0x0;
  this->depth_ = depth;
  this->parent_ = parent;
  this->edge_ = edge;
  std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::vector(&this->children_);
  ValuedAction::ValuedAction(&this->default_move_);
  this->vstar = this;
  this->likelihood = 1.0;
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"Constructed vnode with ");
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    poVar4 = std::operator<<(poVar4," particles");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_40 = 0;
      sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&this->particles_), (ulong)(long)local_40 < sVar2; local_40 = local_40 + 1)
  {
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
      poVar4 = std::operator<<(poVar4," = ");
      ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (&this->particles_,(long)local_40);
      poVar4 = despot::operator<<(poVar4,*ppSVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

VNode::VNode(vector<State*>& particles, int depth, QNode* parent,
	OBS_TYPE edge) :
	particles_(particles),
	belief_(NULL),
	depth_(depth),
	parent_(parent),
	edge_(edge),
	vstar(this),
	likelihood(1) {
	logd << "Constructed vnode with " << particles_.size() << " particles"
		<< endl;
	for (int i = 0; i < particles_.size(); i++) {
		logd << " " << i << " = " << *particles_[i] << endl;
	}
}